

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

FlattenedField * __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,
          FlattenedField *params)

{
  FlattenedField *pFVar1;
  FlattenedField *params_00;
  FlattenedField *params_local;
  ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this_local;
  
  if (this->pos < this->endPtr) {
    pFVar1 = this->pos;
    params_00 = fwd<capnp::JsonCodec::AnnotatedHandler::FlattenedField>(params);
    ctor<capnp::JsonCodec::AnnotatedHandler::FlattenedField,capnp::JsonCodec::AnnotatedHandler::FlattenedField>
              (pFVar1,params_00);
    pFVar1 = this->pos;
    this->pos = pFVar1 + 1;
    return pFVar1;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1a4,"pos < endPtr","\"Added too many elements to ArrayBuilder.\"",
             "Added too many elements to ArrayBuilder.");
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }